

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void send_cors_header(mg_connection *conn)

{
  char *value;
  char *pcVar1;
  
  pcVar1 = mg_get_header(conn,"Origin");
  value = conn->dom_ctx->config[0x34];
  if (((value != (char *)0x0) && (pcVar1 != (char *)0x0 && *value != '\0')) && (*pcVar1 != '\0')) {
    mg_response_header_add(conn,"Access-Control-Allow-Origin",value,-1);
    return;
  }
  return;
}

Assistant:

static void
send_cors_header(struct mg_connection *conn)
{
	const char *origin_hdr = mg_get_header(conn, "Origin");
	const char *cors_orig_cfg =
	    conn->dom_ctx->config[ACCESS_CONTROL_ALLOW_ORIGIN];

	if (cors_orig_cfg && *cors_orig_cfg && origin_hdr && *origin_hdr) {
		/* Cross-origin resource sharing (CORS), see
		 * http://www.html5rocks.com/en/tutorials/cors/,
		 * http://www.html5rocks.com/static/images/cors_server_flowchart.png
		 * CORS preflight is not supported for files. */
		mg_response_header_add(conn,
		                       "Access-Control-Allow-Origin",
		                       cors_orig_cfg,
		                       -1);
	}
}